

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xml_memory_page * __thiscall
pugi::impl::anon_unknown_0::xml_allocator::allocate_page(xml_allocator *this,size_t data_size)

{
  void *memory_00;
  long in_RSI;
  undefined8 *in_RDI;
  xml_memory_page *page;
  void *memory;
  size_t size;
  xml_memory_page *local_8;
  
  memory_00 = (void *)(*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::
                                allocate)(in_RSI + 0x28);
  if (memory_00 == (void *)0x0) {
    local_8 = (xml_memory_page *)0x0;
  }
  else {
    local_8 = xml_memory_page::construct(memory_00);
    local_8->allocator = *(xml_allocator **)*in_RDI;
  }
  return local_8;
}

Assistant:

xml_memory_page* allocate_page(size_t data_size)
		{
			size_t size = sizeof(xml_memory_page) + data_size;

			// allocate block with some alignment, leaving memory for worst-case padding
			void* memory = xml_memory::allocate(size);
			if (!memory) return 0;

			// prepare page structure
			xml_memory_page* page = xml_memory_page::construct(memory);
			assert(page);

			page->allocator = _root->allocator;

			return page;
		}